

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_robust_atomic_counter_op(Impl *this,SPIRVModule *module)

{
  Builder *pBVar1;
  Instruction *pIVar2;
  Block *pBVar3;
  Block *bb;
  Id IVar4;
  Id IVar5;
  Function *pFVar6;
  Id uint_type;
  undefined8 local_108;
  Id local_100;
  Instruction *local_f8;
  Instruction *local_f0;
  Block *entry;
  uint local_dc;
  Builder *local_d8;
  Block *local_d0;
  Id local_c8;
  Id bool_type;
  Function *local_c0;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_b8;
  Block *local_98;
  Block *local_90;
  _Head_base<0UL,_spv::Instruction_*,_false> local_88;
  _Head_base<0UL,_spv::Instruction_*,_false> local_80;
  undefined4 local_74;
  Id uint_ptr_type;
  Id bvec2_type;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  IVar4 = this->robust_atomic_counter_call_id;
  if (IVar4 == 0) {
    pBVar1 = &this->builder;
    local_90 = (this->builder).buildPoint;
    entry = (Block *)0x0;
    IVar4 = spv::Builder::makeUintType(pBVar1,0x20);
    uint_type = IVar4;
    IVar5 = spv::Builder::makeVectorType(pBVar1,IVar4,2);
    local_68._M_head_impl = (Instruction *)0x0;
    uStack_60 = 0;
    local_58 = 0;
    local_100 = IVar4;
    local_108._0_4_ = IVar5;
    local_108._4_4_ = IVar4;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_68,
               &local_108);
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8 = IVar4;
    pFVar6 = spv::Builder::makeFunctionEntry
                       (pBVar1,DecorationMax,IVar4,"RobustPhysicalAtomicCounter",
                        (Vector<Id> *)&local_68,&local_b8,&entry);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_b8);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               &local_68);
    local_98 = (Block *)allocate_in_thread(0x78);
    IVar4 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar4;
    spv::Block::Block(local_98,IVar4,pFVar6);
    local_d0 = (Block *)allocate_in_thread(0x78);
    IVar4 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar4;
    spv::Block::Block(local_d0,IVar4,pFVar6);
    bool_type = spv::Builder::makeBoolType(pBVar1);
    bvec2_type = spv::Builder::makeVectorType(pBVar1,bool_type,2);
    local_d8 = pBVar1;
    IVar4 = spv::Builder::makeNullConstant(pBVar1,IVar5);
    IVar5 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar5;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_b8.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar5);
    local_108._0_4_ = 0xab;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_68,(uint *)&local_b8,&bvec2_type);
    local_c0 = pFVar6;
    spv::Instruction::addIdOperand
              (local_68._M_head_impl,
               (*(pFVar6->parameterInstructions).
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->resultId);
    spv::Instruction::addIdOperand(local_68._M_head_impl,IVar4);
    IVar4 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar4;
    local_108 = (Instruction *)CONCAT44(local_108._4_4_,IVar4);
    local_f0 = (Instruction *)CONCAT44(local_f0._4_4_,0x9a);
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_b8,(uint *)&local_108,&bool_type);
    spv::Instruction::addIdOperand
              ((Instruction *)
               local_b8.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(local_68._M_head_impl)->resultId);
    IVar4 = *(Id *)((long)local_b8.
                          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8);
    local_80._M_head_impl = local_68._M_head_impl;
    local_68._M_head_impl = (Instruction *)0x0;
    add_instruction(this,entry,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_80);
    if (local_80._M_head_impl != (Instruction *)0x0) {
      (*(local_80._M_head_impl)->_vptr_Instruction[1])();
    }
    local_80._M_head_impl = (Instruction *)0x0;
    local_88._M_head_impl =
         (Instruction *)
         local_b8.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_b8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    add_instruction(this,entry,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_88);
    if (local_88._M_head_impl != (Instruction *)0x0) {
      (*(local_88._M_head_impl)->_vptr_Instruction[1])();
    }
    pBVar3 = local_d0;
    pBVar1 = local_d8;
    local_88._M_head_impl = (Instruction *)0x0;
    (this->builder).buildPoint = entry;
    spv::Builder::createSelectionMerge(local_d8,local_d0,0);
    bb = local_98;
    spv::Builder::createConditionalBranch(pBVar1,IVar4,local_98,pBVar3);
    (this->builder).buildPoint = bb;
    uint_ptr_type = spv::Builder::makePointer(pBVar1,StorageClassPhysicalStorageBuffer,local_c8);
    IVar4 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar4;
    local_f0 = (Instruction *)CONCAT44(local_f0._4_4_,IVar4);
    local_f8._0_4_ = 0x7c;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_108,(uint *)&local_f0,&uint_ptr_type);
    pFVar6 = local_c0;
    spv::Instruction::addIdOperand
              (local_108,
               (*(local_c0->parameterInstructions).
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->resultId);
    IVar4 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar4;
    local_f8 = (Instruction *)CONCAT44(local_f8._4_4_,IVar4);
    local_dc = 0xea;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_f0,(uint *)&local_f8,&uint_type);
    spv::Instruction::addIdOperand(local_f0,local_108->resultId);
    pIVar2 = local_f0;
    IVar4 = spv::Builder::makeUintConstant(pBVar1,1,false);
    spv::Instruction::addIdOperand(pIVar2,IVar4);
    pIVar2 = local_f0;
    IVar4 = spv::Builder::makeUintConstant(pBVar1,0,false);
    spv::Instruction::addIdOperand(pIVar2,IVar4);
    spv::Instruction::addIdOperand
              (local_f0,(pFVar6->parameterInstructions).
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]->resultId);
    local_dc = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = local_dc;
    local_74 = 0x80;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_f8,&local_dc,&uint_type);
    spv::Instruction::addIdOperand(local_f8,local_f0->resultId);
    spv::Instruction::addIdOperand
              (local_f8,(pFVar6->parameterInstructions).
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[2]->resultId);
    IVar4 = local_f8->resultId;
    local_38._M_head_impl = local_108;
    local_108 = (Instruction *)0x0;
    add_instruction(this,bb,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                            &local_38);
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    local_40._M_head_impl = local_f0;
    local_f0 = (Instruction *)0x0;
    add_instruction(this,bb,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                            &local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    local_48._M_head_impl = local_f8;
    local_f8 = (Instruction *)0x0;
    add_instruction(this,bb,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                            &local_48);
    if (local_48._M_head_impl != (Instruction *)0x0) {
      (*(local_48._M_head_impl)->_vptr_Instruction[1])();
    }
    spv::Builder::createBranch(local_d8,local_d0);
    if (local_f8 != (Instruction *)0x0) {
      (*local_f8->_vptr_Instruction[1])();
    }
    if (local_f0 != (Instruction *)0x0) {
      (*local_f0->_vptr_Instruction[1])();
    }
    if (local_108 != (Instruction *)0x0) {
      (*local_108->_vptr_Instruction[1])();
    }
    pBVar3 = local_d0;
    (this->builder).buildPoint = local_d0;
    IVar5 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar5;
    local_f0 = (Instruction *)CONCAT44(local_f0._4_4_,IVar5);
    local_f8 = (Instruction *)CONCAT44(local_f8._4_4_,0xf5);
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_108,(uint *)&local_f0,&uint_type);
    pIVar2 = local_108;
    IVar5 = spv::Builder::makeUintConstant(local_d8,0,false);
    spv::Instruction::addIdOperand(pIVar2,IVar5);
    spv::Instruction::addIdOperand
              (local_108,
               *(Id *)((long)(((entry->instructions).
                               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t + 8));
    spv::Instruction::addIdOperand(local_108,IVar4);
    spv::Instruction::addIdOperand
              (local_108,
               *(Id *)((long)(((bb->instructions).
                               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t + 8));
    IVar4 = local_108->resultId;
    local_50._M_head_impl = local_108;
    local_108 = (Instruction *)0x0;
    add_instruction(this,pBVar3,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_50);
    if (local_50._M_head_impl != (Instruction *)0x0) {
      (*(local_50._M_head_impl)->_vptr_Instruction[1])();
    }
    spv::Builder::makeReturn(local_d8,false,IVar4);
    (this->builder).buildPoint = local_90;
    IVar4 = (local_c0->functionInstruction).resultId;
    this->robust_atomic_counter_call_id = IVar4;
    if (local_108 != (Instruction *)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
    if (local_b8.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_b8.
                            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (local_68._M_head_impl != (Instruction *)0x0) {
      (*(local_68._M_head_impl)->_vptr_Instruction[1])();
    }
  }
  return IVar4;
}

Assistant:

spv::Id SPIRVModule::Impl::build_robust_atomic_counter_op(SPIRVModule &module)
{
	if (robust_atomic_counter_call_id)
		return robust_atomic_counter_call_id;

	auto *current_build_point = builder.getBuildPoint();

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id bda_type = builder.makeVectorType(uint_type, 2);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, uint_type,
	                                       "RobustPhysicalAtomicCounter",
	                                       { bda_type, uint_type, uint_type }, {}, &entry);

	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);

	spv::Id bool_type = builder.makeBoolType();
	spv::Id bvec2_type = builder.makeVectorType(bool_type, 2);

	spv::Id null_bda = builder.makeNullConstant(bda_type);
	auto compare = std::make_unique<spv::Instruction>(builder.getUniqueId(), bvec2_type, spv::OpINotEqual);
	compare->addIdOperand(func->getParamId(0));
	compare->addIdOperand(null_bda);
	auto not_zero = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpAny);
	not_zero->addIdOperand(compare->getResultId());
	spv::Id cond_id = not_zero->getResultId();
	add_instruction(entry, std::move(compare));
	add_instruction(entry, std::move(not_zero));
	builder.setBuildPoint(entry);
	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(cond_id, body_block, merge_block);

	spv::Id loaded_id;
	{
		builder.setBuildPoint(body_block);
		spv::Id uint_ptr_type = builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type);
		auto bitcast_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_ptr_type, spv::OpBitcast);
		bitcast_op->addIdOperand(func->getParamId(0));
		auto atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
		atomic_op->addIdOperand(bitcast_op->getResultId());
		atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		atomic_op->addIdOperand(builder.makeUintConstant(0));
		atomic_op->addIdOperand(func->getParamId(1));
		auto add_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		add_op->addIdOperand(atomic_op->getResultId());
		add_op->addIdOperand(func->getParamId(2));
		loaded_id = add_op->getResultId();
		add_instruction(body_block, std::move(bitcast_op));
		add_instruction(body_block, std::move(atomic_op));
		add_instruction(body_block, std::move(add_op));
		builder.createBranch(merge_block);
	}

	builder.setBuildPoint(merge_block);
	auto phi_op = std::make_unique<spv::Instruction>(
	    builder.getUniqueId(), uint_type, spv::OpPhi);
	phi_op->addIdOperand(builder.makeUintConstant(0));
	phi_op->addIdOperand(entry->getId());
	phi_op->addIdOperand(loaded_id);
	phi_op->addIdOperand(body_block->getId());
	spv::Id return_value = phi_op->getResultId();
	add_instruction(merge_block, std::move(phi_op));
	builder.makeReturn(false, return_value);

	builder.setBuildPoint(current_build_point);
	robust_atomic_counter_call_id = func->getId();
	return func->getId();
}